

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * rbuStrndup(char *zStr,int *pRc)

{
  int iVar1;
  size_t sVar2;
  void *__dest;
  char *pcVar3;
  
  if (zStr != (char *)0x0) {
    sVar2 = strlen(zStr);
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      __dest = sqlite3Malloc(sVar2 + 1);
    }
    else {
      __dest = (void *)0x0;
    }
    if (__dest != (void *)0x0) {
      pcVar3 = (char *)memcpy(__dest,zStr,sVar2 + 1);
      return pcVar3;
    }
    *pRc = 7;
  }
  return (char *)0x0;
}

Assistant:

static char *rbuStrndup(const char *zStr, int *pRc){
  char *zRet = 0;

  assert( *pRc==SQLITE_OK );
  if( zStr ){
    size_t nCopy = strlen(zStr) + 1;
    zRet = (char*)sqlite3_malloc64(nCopy);
    if( zRet ){
      memcpy(zRet, zStr, nCopy);
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }

  return zRet;
}